

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

string * __thiscall
OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_
          (string *__return_storage_ptr__,SslConnection *this)

{
  ulong uVar1;
  string buf;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = ERR_get_error();
  uVar1 = uVar1 & 0xffffffff;
  if (uVar1 != 0) {
    do {
      local_58 = local_48;
      std::__cxx11::string::_M_construct((ulong)&local_58,'\0');
      ERR_error_string_n(uVar1,(char *)local_58,local_50);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = ERR_get_error();
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      uVar1 = uVar1 & 0xffffffff;
    } while (uVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

string SslConnection::GetSslErrAsString()
    {
        /*BIO *bio = BIO_new(BIO_s_mem());
        ERR_print_errors(bio);
        char *buf = NULL;
        size_t len = BIO_get_mem_data(bio, &buf);
        string strTmp(buf, len);
        BIO_free(bio);*/

        string strTmp;
        uint32_t nError = ERR_get_error();
        while (nError != 0)
        {
            string buf(512, 0);
            ERR_error_string_n(nError, &buf[0], buf.size());
            strTmp += &buf[0];
            strTmp += "\r\n";
            nError = ERR_get_error();
        }
        return strTmp;
    }